

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<int,3ul>>
               (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *src,
               vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  pointer paVar1;
  ulong uVar2;
  pointer puVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  __node_base _Var6;
  uint uVar7;
  size_type __new_size;
  long lVar8;
  bool bVar9;
  bool bVar10;
  uint32_t vidx;
  unordered_map<unsigned_int,_std::array<int,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>_>
  vdata;
  uint local_84;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_80;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)0x0) {
    bVar10 = false;
  }
  else {
    uVar2 = (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    bVar10 = false;
    if ((((long)(src->
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(src->
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - uVar2 == 0)
       && (2 < uVar2)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      puVar3 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar10 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish == puVar3;
      if (bVar10) {
        __new_size = 1;
      }
      else {
        lVar8 = 0;
        uVar2 = 0;
        uVar7 = 0;
        local_80 = src;
        local_78 = dst;
        local_70 = faceVertexIndices;
        do {
          local_84 = puVar3[uVar2];
          if (uVar7 < local_84) {
            uVar7 = local_84;
          }
          sVar4 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&local_68,&local_84);
          if (sVar4 == 0) {
            paVar1 = (local_80->
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pmVar5 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_84);
            *(undefined8 *)pmVar5->_M_elems = *(undefined8 *)((long)paVar1->_M_elems + lVar8);
            pmVar5->_M_elems[2] = *(int *)((long)paVar1->_M_elems + lVar8 + 8);
          }
          else {
            pmVar5 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_84);
            paVar1 = (local_80->
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (((pmVar5->_M_elems[0] != *(int *)((long)paVar1->_M_elems + lVar8)) ||
                (pmVar5->_M_elems[1] != *(int *)((long)paVar1->_M_elems + lVar8 + 4))) ||
               (pmVar5->_M_elems[2] != *(int *)((long)paVar1->_M_elems + lVar8 + 8)))
            goto LAB_003888cb;
          }
          uVar2 = uVar2 + 1;
          puVar3 = (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0xc;
          bVar9 = uVar2 < (ulong)((long)(local_70->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3
                                 >> 2);
          bVar10 = !bVar9;
        } while (bVar9);
        __new_size = (size_type)(uVar7 + 1);
        dst = local_78;
      }
      ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::resize
                (dst,__new_size);
      memset((dst->super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)
             ._M_impl.super__Vector_impl_data._M_start,0,__new_size * 0xc);
      for (_Var6._M_nxt = local_68._M_before_begin._M_nxt; _Var6._M_nxt != (_Hash_node_base *)0x0;
          _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
        uVar7 = *(uint *)&_Var6._M_nxt[1]._M_nxt;
        paVar1 = (dst->
                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        paVar1[uVar7]._M_elems[2] = *(int *)((long)&_Var6._M_nxt[2]._M_nxt + 4);
        *(undefined8 *)paVar1[uVar7]._M_elems = *(undefined8 *)((long)&_Var6._M_nxt[1]._M_nxt + 4);
      }
LAB_003888cb:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar10;
}

Assistant:

bool TryConvertFacevaryingToVertexInt(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}